

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManPrintMatches(Nf_Man_t *p)

{
  Nf_Obj_t *pNVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0x50;
  uVar5 = 0;
  while( true ) {
    if ((long)p->pGia->nObjs <= (long)uVar5) {
      return;
    }
    pGVar3 = Gia_ManObj(p->pGia,(int)uVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      pNVar1 = p->pNfObjs;
      printf("%5d : ",uVar5 & 0xffffffff);
      uVar2 = *(ulong *)((long)(pNVar1->M + -2) + 0x18 + lVar4);
      printf("Dp = %6.2f  ",
             (double)(float)((double)((uint)uVar2 & 0x3fffffff) * 0.001 +
                            (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741.824));
      uVar2 = *(ulong *)((long)(pNVar1->M + -1) + 0x18 + lVar4);
      printf("Dn = %6.2f  ",
             (double)(float)((double)((uint)uVar2 & 0x3fffffff) * 0.001 +
                            (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741.824));
      printf("  ");
      uVar2 = *(ulong *)((long)(pNVar1->M + -1) + lVar4);
      printf("Ap = %6.2f  ",
             (double)(float)((double)((uint)uVar2 & 0x3fffffff) * 0.001 +
                            (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741.824));
      uVar2 = *(ulong *)(&pNVar1->M[0][0].field_0x0 + lVar4);
      printf("An = %6.2f  ",
             (double)(float)((double)((uint)uVar2 & 0x3fffffff) * 0.001 +
                            (double)(uVar2 >> 0x1e & 0xffffffff) * 1073741.824));
      printf("  ");
      printf("Dp = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -2) + 0x10 + lVar4) & 0xfffff].pName);
      printf("Dn = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -1) + 0x10 + lVar4) & 0xfffff].pName);
      printf("Ap = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -2) + 0x28 + lVar4) & 0xfffff].pName);
      printf("An = %8s ",
             p->pCells[(ulong)*(uint *)((long)(pNVar1->M + -1) + 0x28 + lVar4) & 0xfffff].pName);
      putchar(10);
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x60;
  }
  return;
}

Assistant:

void Nf_ManPrintMatches( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        Nf_Mat_t * pDp = Nf_ObjMatchD( p, i, 0 );
        Nf_Mat_t * pAp = Nf_ObjMatchA( p, i, 0 );
        Nf_Mat_t * pDn = Nf_ObjMatchD( p, i, 1 );
        Nf_Mat_t * pAn = Nf_ObjMatchA( p, i, 1 );

        printf( "%5d : ", i );
        printf( "Dp = %6.2f  ", Nf_Wrd2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Nf_Wrd2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Nf_Wrd2Flt(pAp->D) );
        printf( "An = %6.2f  ", Nf_Wrd2Flt(pAn->D) );
        printf( "  " );
        printf( "Dp = %8s ", Nf_ManCell(p, pDp->Gate)->pName );
        printf( "Dn = %8s ", Nf_ManCell(p, pDn->Gate)->pName );
        printf( "Ap = %8s ", Nf_ManCell(p, pAp->Gate)->pName );
        printf( "An = %8s ", Nf_ManCell(p, pAn->Gate)->pName );
        printf( "\n" );

    }
}